

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

TheoryAtom * Potassco::TheoryAtom::newAtom(Id_t a,Id_t term,IdSpan *args)

{
  ulong uVar1;
  uint32_t uVar2;
  TheoryAtom *pTVar3;
  
  pTVar3 = (TheoryAtom *)operator_new(args->size * 4 + 0xc);
  *(Id_t *)pTVar3 = a & 0x7fffffff;
  pTVar3->termId_ = term;
  uVar1 = args->size;
  uVar2 = (uint32_t)uVar1;
  pTVar3->nTerms_ = uVar2;
  if (uVar2 != 0) {
    memcpy(pTVar3 + 1,args->first,(uVar1 & 0xffffffff) << 2);
  }
  return pTVar3;
}

Assistant:

TheoryAtom* TheoryAtom::newAtom(Id_t a, Id_t term, const IdSpan& args) {
	return new (::operator new(nBytes<TheoryAtom>(args))) TheoryAtom(a, term, args, 0, 0);
}